

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseNamespace(TidyDocImpl *doc,Node *basenode,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  AttVal *pAVar3;
  Node *pNVar4;
  bool bVar5;
  TidyTagId TVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node **ppNVar9;
  Node *node;
  bool bVar10;
  Node *local_58;
  undefined8 uStack_50;
  ulong local_48;
  Node *pNStack_40;
  Node *local_38;
  
  pLVar2 = doc->lexer;
  prvTidyDeferDup(doc);
  uVar1 = pLVar2->istackbase;
  pLVar2->istackbase = pLVar2->istacksize;
  pNVar7 = prvTidyGetToken(doc,OtherNamespace);
  node = basenode;
  do {
    if (pNVar7 == (Node *)0x0) {
      prvTidyReport(doc,basenode->parent,basenode,0x25a);
      return;
    }
    if (pNVar7->type == StartTag) {
      for (pAVar3 = pNVar7->attributes; pNVar8 = pNVar7, pAVar3 != (AttVal *)0x0;
          pAVar3 = pAVar3->next) {
        pAVar3->dict = (Attribute *)0x0;
      }
LAB_00141042:
      pNVar7->parent = node;
      pNVar4 = node->last;
      ppNVar9 = &pNVar4->next;
      if (pNVar4 == (Node *)0x0) {
        ppNVar9 = &node->content;
      }
      pNVar7->prev = pNVar4;
      *ppNVar9 = pNVar7;
      node->last = pNVar7;
    }
    else {
      if (pNVar7->type != EndTag) {
        for (pAVar3 = pNVar7->attributes; pNVar8 = node, pAVar3 != (AttVal *)0x0;
            pAVar3 = pAVar3->next) {
          pAVar3->dict = (Attribute *)0x0;
        }
        goto LAB_00141042;
      }
      local_58 = (Node *)0x0;
      uStack_50 = 0;
      if (pNVar7->tag == (Dict *)0x0) {
        TVar6 = TidyTag_UNKNOWN;
      }
      else {
        TVar6 = pNVar7->tag->id;
      }
      local_48 = (ulong)TVar6;
      pNStack_40 = pNVar7;
      local_38 = basenode;
      prvTidyTraverseNodeTree((TidyDocImpl *)0x0,node,FindDescendant_cb,&local_58);
      pNVar8 = local_58;
      if (local_58 == (Node *)0x0) {
        prvTidyReport(doc,node,pNVar7,0x235);
        if (node == (Node *)0x0) {
          __assert_fail("parent",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/parser.c"
                        ,0x5e2,"void prvTidyParseNamespace(TidyDocImpl *, Node *, GetTokenMode)");
        }
        prvTidyFreeNode(doc,pNVar7);
        bVar5 = true;
      }
      else {
        for (; ((node != (Node *)0x0 && (node != pNVar8)) && (node != basenode->parent));
            node = node->parent) {
          node->closed = yes;
          prvTidyReport(doc,node->parent,node,0x259);
        }
        node->closed = yes;
        prvTidyFreeNode(doc,pNVar7);
        pNVar7 = node->parent;
        bVar5 = true;
        bVar10 = node == basenode;
        node = pNVar7;
        if (bVar10) {
          pLVar2->istackbase = uVar1;
          if (basenode->closed != yes) {
            __assert_fail("basenode->closed == yes",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/parser.c"
                          ,0x5d9,"void prvTidyParseNamespace(TidyDocImpl *, Node *, GetTokenMode)");
          }
          bVar5 = false;
        }
      }
      pNVar8 = node;
      if (!bVar5) {
        return;
      }
    }
    pNVar7 = prvTidyGetToken(doc,OtherNamespace);
    node = pNVar8;
  } while( true );
}

Assistant:

void TY_(ParseNamespace)(TidyDocImpl* doc, Node *basenode, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Node *parent = basenode;
    uint istackbase;
    AttVal* av; /* #130 MathML attr and entity fix! */

    /* a la <table>: defer popping elements off the inline stack */
    TY_(DeferDup)( doc );
    istackbase = lexer->istackbase;
    lexer->istackbase = lexer->istacksize;

    mode = OtherNamespace; /* Preformatted; IgnoreWhitespace; */

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /*
        fix check to skip action in InsertMisc for regular/empty
        nodes, which we don't want here...

        The way we do it here is by checking and processing everything
        and only what remains goes into InsertMisc()
        */

        /* is this a close tag? And does it match the current parent node? */
        if (node->type == EndTag)
        {
            /*
            to prevent end tags flowing from one 'alternate namespace' we
            check this in two phases: first we check if the tag is a
            descendant of the current node, and when it is, we check whether
            it is the end tag for a node /within/ or /outside/ the basenode.
            */
            Bool outside;
            Node *mp = FindMatchingDescendant(parent, node, basenode, &outside);

            if (mp != NULL)
            {
                /*
                when mp != parent as we might expect,
                infer end tags until we 'hit' the matched
                parent or the basenode
                */
                Node *n;

                for (n = parent;
                     n != NULL && n != basenode->parent && n != mp;
                     n = n->parent)
                {
                    /* n->implicit = yes; */
                    n->closed = yes;
                    TY_(Report)(doc, n->parent, n, MISSING_ENDTAG_BEFORE);
                }

                /* Issue #369 - Since 'assert' is DEBUG only, and there are
                   simple cases where these can be fired, removing them
                   pending feedback from the original author!
                   assert(outside == no ? n == mp : 1);
                   assert(outside == yes ? n == basenode->parent : 1);
                   =================================================== */

                if (outside == no)
                {
                    /* EndTag for a node within the basenode subtree. Roll on... */
                    n->closed = yes;
                    TY_(FreeNode)(doc, node);

                    node = n;
                    parent = node->parent;
                }
                else
                {
                    /* EndTag for a node outside the basenode subtree: let the caller handle that. */
                    TY_(UngetToken)( doc );
                    node = basenode;
                    parent = node->parent;
                }

                /* when we've arrived at the end-node for the base node, it's quitting time */
                if (node == basenode)
                {
                    lexer->istackbase = istackbase;
                    assert(basenode->closed == yes);
                    return;
                }
            }
            else
            {
                /* unmatched close tag: report an error and discard */
                /* TY_(Report)(doc, parent, node, NON_MATCHING_ENDTAG); Issue #308 - Seems wrong warning! */
                TY_(Report)(doc, parent, node, DISCARDING_UNEXPECTED);
                assert(parent);
                /* assert(parent->tag != node->tag); Issue #308 - Seems would always be true! */
                TY_(FreeNode)( doc, node); /* Issue #308 - Discard unexpected end tag memory */
            }
        }
        else if (node->type == StartTag)
        {
            /* #130 MathML attr and entity fix! 
               care if it has attributes, and 'accidently' any of those attributes match known */
            for ( av = node->attributes; av; av = av->next )
            {
                av->dict = 0; /* does something need to be freed? */
            }
            /* add another child to the current parent */
            TY_(InsertNodeAtEnd)(parent, node);
            parent = node;
        }
        else
        {
            /* #130 MathML attr and entity fix! 
               care if it has attributes, and 'accidently' any of those attributes match known */
            for ( av = node->attributes; av; av = av->next )
            {
                av->dict = 0; /* does something need to be freed? */
            }
            TY_(InsertNodeAtEnd)(parent, node);
        }
    }

    TY_(Report)(doc, basenode->parent, basenode, MISSING_ENDTAG_FOR);
}